

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

void __thiscall Node::key_t::key_t(key_t *this)

{
  allocator local_25 [20];
  allocator local_11;
  key_t *local_10;
  key_t *this_local;
  
  this->c = 0;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->o,"0",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->t = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->d,"0",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  return;
}

Assistant:

Node::key_t::key_t():c(0),o("0"),t(0),d("0"){}